

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_7z.c
# Opt level: O3

int szipLoadEntries(SZIPinfo *info)

{
  UInt32 UVar1;
  int iVar2;
  int iVar3;
  PHYSFS_uint32 idx;
  
  iVar2 = __PHYSFS_DirTreeInit(&info->tree,0x30);
  if (iVar2 == 0) {
LAB_0010d91a:
    iVar2 = 0;
  }
  else {
    UVar1 = (info->db).NumFiles;
    iVar2 = 1;
    if (UVar1 != 0) {
      idx = 0;
      do {
        iVar3 = szipLoadEntry(info,idx);
        if (iVar3 == 0) goto LAB_0010d91a;
        idx = idx + 1;
      } while (UVar1 != idx);
    }
  }
  return iVar2;
}

Assistant:

static int szipLoadEntries(SZIPinfo *info)
{
    int retval = 0;

    if (__PHYSFS_DirTreeInit(&info->tree, sizeof (SZIPentry)))
    {
        const PHYSFS_uint32 count = info->db.NumFiles;
        PHYSFS_uint32 i;
        for (i = 0; i < count; i++)
            BAIL_IF_ERRPASS(!szipLoadEntry(info, i), 0);
        retval = 1;
    } /* if */

    return retval;
}